

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateChangePerfTestCases.cpp
# Opt level: O3

void deqp::gls::anon_unknown_1::genIndices
               (vector<unsigned_short,_std::allocator<unsigned_short>_> *indices,int triangleCount)

{
  undefined8 in_RAX;
  unsigned_short *puVar1;
  unsigned_short uVar2;
  iterator iVar3;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
            (indices,(long)(triangleCount * 3));
  if (0 < triangleCount) {
    uVar2 = 0;
    do {
      uStack_38 = CONCAT26(uVar2,(undefined6)uStack_38);
      iVar3._M_current =
           (indices->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      puVar1 = (indices->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      if (iVar3._M_current == puVar1) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
        _M_realloc_insert<unsigned_short>(indices,iVar3,(unsigned_short *)((long)&uStack_38 + 6));
        iVar3._M_current =
             (indices->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        puVar1 = (indices->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      else {
        *iVar3._M_current = uVar2;
        iVar3._M_current = iVar3._M_current + 1;
        (indices->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current;
      }
      uStack_38._0_6_ = CONCAT24(uVar2 + 1,(undefined4)uStack_38);
      if (iVar3._M_current == puVar1) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
        _M_realloc_insert<unsigned_short>(indices,iVar3,(unsigned_short *)((long)&uStack_38 + 4));
        iVar3._M_current =
             (indices->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        puVar1 = (indices->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      else {
        *iVar3._M_current = uVar2 + 1;
        iVar3._M_current = iVar3._M_current + 1;
        (indices->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current;
      }
      uStack_38._0_4_ = CONCAT22(uVar2 + 2,(undefined2)uStack_38);
      if (iVar3._M_current == puVar1) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
        _M_realloc_insert<unsigned_short>(indices,iVar3,(unsigned_short *)((long)&uStack_38 + 2));
      }
      else {
        *iVar3._M_current = uVar2 + 2;
        (indices->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      uVar2 = uVar2 + 3;
      triangleCount = triangleCount + -1;
    } while (triangleCount != 0);
  }
  return;
}

Assistant:

void genIndices (vector<GLushort>& indices, int triangleCount)
{
	indices.reserve(triangleCount*3);

	for (int triangleNdx = 0; triangleNdx < triangleCount; triangleNdx++)
	{
		indices.push_back((GLushort)(triangleNdx*3));
		indices.push_back((GLushort)(triangleNdx*3+1));
		indices.push_back((GLushort)(triangleNdx*3+2));
	}
}